

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ExpressionResultBuilder * __thiscall
Catch::ExpressionLhs<sisl::cartesian_cubic<float>*const&>::
captureExpression<(Catch::Internal::Operator)1,long>
          (ExpressionLhs<sisl::cartesian_cubic<float>*const&> *this,long *rhs)

{
  bool result;
  ExpressionResultBuilder *pEVar1;
  char *pcVar2;
  allocator local_89;
  string local_88 [32];
  Catch local_68 [48];
  Catch local_38 [32];
  long *local_18;
  long *rhs_local;
  ExpressionLhs<sisl::cartesian_cubic<float>_*const_&> *this_local;
  
  local_18 = rhs;
  rhs_local = (long *)this;
  result = Internal::compare<(Catch::Internal::Operator)1,sisl::cartesian_cubic<float>>
                     ((cartesian_cubic<float> *)**(undefined8 **)(this + 0x228),*rhs);
  pEVar1 = ExpressionResultBuilder::setResultType((ExpressionResultBuilder *)this,result);
  toString<sisl::cartesian_cubic<float>*>(local_38,*(cartesian_cubic<float> ***)(this + 0x228));
  pEVar1 = ExpressionResultBuilder::setLhs(pEVar1,(string *)local_38);
  toString<long>(local_68,local_18);
  pEVar1 = ExpressionResultBuilder::setRhs(pEVar1,(string *)local_68);
  pcVar2 = Internal::OperatorTraits<(Catch::Internal::Operator)1>::getName();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,pcVar2,&local_89);
  pEVar1 = ExpressionResultBuilder::setOp(pEVar1,(string *)local_88);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)local_38);
  return pEVar1;
}

Assistant:

ExpressionResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_result
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }